

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O2

void __thiscall QAbstractButton::focusInEvent(QAbstractButton *this,QFocusEvent *e)

{
  QAbstractButtonPrivate::fixFocusPolicy
            (*(QAbstractButtonPrivate **)&(this->super_QWidget).field_0x8);
  QWidget::focusInEvent(&this->super_QWidget,e);
  return;
}

Assistant:

void QAbstractButton::focusInEvent(QFocusEvent *e)
{
    Q_D(QAbstractButton);
#ifdef QT_KEYPAD_NAVIGATION
    if (!QApplicationPrivate::keypadNavigationEnabled())
#endif
    d->fixFocusPolicy();
    QWidget::focusInEvent(e);
}